

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleRule>::moveAppend
          (QGenericArrayOps<QCss::StyleRule> *this,StyleRule *b,StyleRule *e)

{
  qsizetype *pqVar1;
  StyleRule *pSVar2;
  long lVar3;
  Data *pDVar4;
  Selector *pSVar5;
  qsizetype qVar6;
  Data *pDVar7;
  Declaration *pDVar8;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::StyleRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::StyleRule>).size;
      pDVar4 = (b->selectors).d.d;
      (b->selectors).d.d = (Data *)0x0;
      pSVar2[lVar3].selectors.d.d = pDVar4;
      pSVar5 = (b->selectors).d.ptr;
      (b->selectors).d.ptr = (Selector *)0x0;
      pSVar2[lVar3].selectors.d.ptr = pSVar5;
      qVar6 = (b->selectors).d.size;
      (b->selectors).d.size = 0;
      pSVar2[lVar3].selectors.d.size = qVar6;
      pDVar7 = (b->declarations).d.d;
      (b->declarations).d.d = (Data *)0x0;
      pSVar2[lVar3].declarations.d.d = pDVar7;
      pDVar8 = (b->declarations).d.ptr;
      (b->declarations).d.ptr = (Declaration *)0x0;
      pSVar2[lVar3].declarations.d.ptr = pDVar8;
      qVar6 = (b->declarations).d.size;
      (b->declarations).d.size = 0;
      pSVar2[lVar3].declarations.d.size = qVar6;
      pSVar2[lVar3].order = b->order;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::StyleRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }